

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::UntypedMapBase::DeleteNode(UntypedMapBase *this,NodeBase *node)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  MessageLite *this_00;
  
  switch((this->type_info_).field_0x3 & 0xf) {
  case 0:
    GetKey<bool>(this,node);
    break;
  case 1:
    GetKey<unsigned_int>(this,node);
    break;
  case 2:
    GetKey<unsigned_long>(this,node);
    break;
  default:
    DeleteNode();
    goto switchD_00243090_default;
  case 5:
    pbVar2 = GetKey<std::__cxx11::string>(this,node);
    pcVar1 = (pbVar2->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &pbVar2->field_2) {
      operator_delete(pcVar1,(pbVar2->field_2)._M_allocated_capacity + 1);
    }
  }
  switch((byte)(this->type_info_).field_0x3 >> 4) {
  case 0:
    GetValue<bool>(this,node);
    break;
  case 1:
    GetValue<unsigned_int>(this,node);
    break;
  case 2:
    GetValue<unsigned_long>(this,node);
    break;
  case 3:
    GetValue<float>(this,node);
    break;
  case 4:
    GetValue<double>(this,node);
    break;
  case 5:
    pbVar2 = GetValue<std::__cxx11::string>(this,node);
    pcVar1 = (pbVar2->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &pbVar2->field_2) {
      operator_delete(pcVar1,(pbVar2->field_2)._M_allocated_capacity + 1);
    }
    break;
  case 6:
    this_00 = GetValue<google::protobuf::MessageLite>(this,node);
    MessageLite::DestroyInstance(this_00);
    break;
  default:
switchD_00243090_default:
    DeleteNode();
  }
  DeallocNode(this,node,(ulong)(this->type_info_).node_size);
  return;
}

Assistant:

void UntypedMapBase::DeleteNode(NodeBase* node) {
  const auto destroy = absl::Overload{
      [](std::string* str) { str->~basic_string(); },
      [](MessageLite* msg) { msg->DestroyInstance(); }, [](void*) {}};
  VisitKey(node, destroy);
  VisitValue(node, destroy);
  DeallocNode(node);
}